

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.cpp
# Opt level: O0

Optional<llvm::ReplacementItem> * __thiscall
llvm::formatv_object_base::parseReplacementItem
          (Optional<llvm::ReplacementItem> *__return_storage_ptr__,formatv_object_base *this,
          StringRef Spec)

{
  StringRef Options_00;
  StringRef Spec_00;
  type_conflict1 tVar1;
  bool bVar2;
  char cVar3;
  ReplacementItem local_178;
  StringRef local_138;
  StringRef local_128;
  StringRef local_118;
  StringRef local_108;
  StringRef local_f8;
  StringRef local_e8;
  StringRef local_d8;
  StringRef local_c8;
  StringRef local_b8;
  StringRef local_a8;
  StringRef local_98;
  StringRef local_88;
  StringRef local_78;
  unsigned_long local_68;
  size_t Index;
  StringRef Options;
  size_t sStack_48;
  AlignStyle Where;
  size_t Align;
  undefined1 auStack_38 [7];
  char Pad;
  undefined1 local_28 [8];
  StringRef RepString;
  StringRef Spec_local;
  
  RepString.Length = (size_t)this;
  StringRef::StringRef((StringRef *)auStack_38,"{}");
  _local_28 = StringRef::trim((StringRef *)&RepString.Length,_auStack_38);
  Align._7_1_ = ' ';
  sStack_48 = 0;
  Options.Length._4_4_ = Right;
  StringRef::StringRef((StringRef *)&Index);
  local_68 = 0;
  StringRef::StringRef(&local_88," \t\n\v\f\r");
  local_78 = StringRef::trim((StringRef *)local_28,local_88);
  local_28 = (undefined1  [8])local_78.Data;
  RepString.Data = (char *)local_78.Length;
  tVar1 = StringRef::consumeInteger<unsigned_long>((StringRef *)local_28,0,&local_68);
  if (tVar1) {
    __assert_fail("false && \"Invalid replacement sequence index!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/FormatVariadic.cpp"
                  ,0x45,
                  "static Optional<ReplacementItem> llvm::formatv_object_base::parseReplacementItem(StringRef)"
                 );
  }
  StringRef::StringRef(&local_a8," \t\n\v\f\r");
  local_98 = StringRef::trim((StringRef *)local_28,local_a8);
  local_28 = (undefined1  [8])local_98.Data;
  RepString.Data = (char *)local_98.Length;
  bVar2 = StringRef::empty((StringRef *)local_28);
  if ((!bVar2) && (cVar3 = StringRef::front((StringRef *)local_28), cVar3 == ',')) {
    local_b8 = StringRef::drop_front((StringRef *)local_28,1);
    local_28 = (undefined1  [8])local_b8.Data;
    RepString.Data = (char *)local_b8.Length;
    bVar2 = consumeFieldLayout((StringRef *)local_28,(AlignStyle *)((long)&Options.Length + 4),
                               &stack0xffffffffffffffb8,(char *)((long)&Align + 7));
    if (!bVar2) {
      __assert_fail("false && \"Invalid replacement field layout specification!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/FormatVariadic.cpp"
                    ,0x4c,
                    "static Optional<ReplacementItem> llvm::formatv_object_base::parseReplacementItem(StringRef)"
                   );
    }
  }
  StringRef::StringRef(&local_d8," \t\n\v\f\r");
  local_c8 = StringRef::trim((StringRef *)local_28,local_d8);
  local_28 = (undefined1  [8])local_c8.Data;
  RepString.Data = (char *)local_c8.Length;
  bVar2 = StringRef::empty((StringRef *)local_28);
  if ((!bVar2) && (cVar3 = StringRef::front((StringRef *)local_28), cVar3 == ':')) {
    local_f8 = StringRef::drop_front((StringRef *)local_28,1);
    StringRef::StringRef(&local_108," \t\n\v\f\r");
    local_e8 = StringRef::trim(&local_f8,local_108);
    Index = (size_t)local_e8.Data;
    Options.Data = (char *)local_e8.Length;
    memset(&local_118,0,0x10);
    StringRef::StringRef(&local_118);
    local_28 = (undefined1  [8])local_118.Data;
    RepString.Data = (char *)local_118.Length;
  }
  StringRef::StringRef(&local_138," \t\n\v\f\r");
  local_128 = StringRef::trim((StringRef *)local_28,local_138);
  _local_28 = local_128;
  bVar2 = StringRef::empty((StringRef *)local_28);
  if (bVar2) {
    Spec_00.Length = (size_t)Spec.Data;
    Spec_00.Data = (char *)RepString.Length;
    Options_00.Length = (size_t)Options.Data;
    Options_00.Data = (char *)Index;
    ReplacementItem::ReplacementItem
              (&local_178,Spec_00,local_68,sStack_48,Options.Length._4_4_,Align._7_1_,Options_00);
    Optional<llvm::ReplacementItem>::Optional(__return_storage_ptr__,&local_178);
    return __return_storage_ptr__;
  }
  __assert_fail("false && \"Unexpected characters found in replacement string!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/FormatVariadic.cpp"
                ,0x55,
                "static Optional<ReplacementItem> llvm::formatv_object_base::parseReplacementItem(StringRef)"
               );
}

Assistant:

Optional<ReplacementItem>
formatv_object_base::parseReplacementItem(StringRef Spec) {
  StringRef RepString = Spec.trim("{}");

  // If the replacement sequence does not start with a non-negative integer,
  // this is an error.
  char Pad = ' ';
  std::size_t Align = 0;
  AlignStyle Where = AlignStyle::Right;
  StringRef Options;
  size_t Index = 0;
  RepString = RepString.trim();
  if (RepString.consumeInteger(0, Index)) {
    assert(false && "Invalid replacement sequence index!");
    return ReplacementItem{};
  }
  RepString = RepString.trim();
  if (!RepString.empty() && RepString.front() == ',') {
    RepString = RepString.drop_front();
    if (!consumeFieldLayout(RepString, Where, Align, Pad))
      assert(false && "Invalid replacement field layout specification!");
  }
  RepString = RepString.trim();
  if (!RepString.empty() && RepString.front() == ':') {
    Options = RepString.drop_front().trim();
    RepString = StringRef();
  }
  RepString = RepString.trim();
  if (!RepString.empty()) {
    assert(false && "Unexpected characters found in replacement string!");
  }

  return ReplacementItem{Spec, Index, Align, Where, Pad, Options};
}